

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::WriteMacOSXContentBuild
          (cmGlobalNinjaGenerator *this,string *input,string *output,string *config)

{
  int iVar1;
  undefined4 extraout_var;
  cmNinjaBuild build;
  allocator<char> local_169;
  string local_168;
  undefined1 local_148 [136];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_c0 [152];
  
  AddMacOSXContentRule(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"COPY_OSX_CONTENT",&local_169);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_148,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_148 + 0x40)
             ,output);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_c0,input);
  iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x41])(this,config);
  WriteBuild(this,(ostream *)CONCAT44(extraout_var,iVar1),(cmNinjaBuild *)local_148,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_148);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteMacOSXContentBuild(std::string input,
                                                     std::string output,
                                                     const std::string& config)
{
  this->AddMacOSXContentRule();
  {
    cmNinjaBuild build("COPY_OSX_CONTENT");
    build.Outputs.push_back(std::move(output));
    build.ExplicitDeps.push_back(std::move(input));
    this->WriteBuild(*this->GetImplFileStream(config), build);
  }
}